

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData160 * cfd::core::HashUtil::Hash160(ByteData160 *__return_storage_ptr__,ByteData *data)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28,data);
  Hash160(__return_storage_ptr__,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_28
         );
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

ByteData160 HashUtil::Hash160(const ByteData &data) {
  return Hash160(data.GetBytes());
}